

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

tmsize_t TIFFReadRawStrip1(TIFF *tif,uint32_t strip,void *buf,tmsize_t size,char *module)

{
  int iVar1;
  uint64_t uVar2;
  tmsize_t tVar3;
  tmsize_t mb;
  tmsize_t n;
  tmsize_t ma;
  tmsize_t cc;
  char *module_local;
  tmsize_t size_local;
  void *buf_local;
  uint32_t strip_local;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x20000) == 0) {
    tif_local = (TIFF *)size;
    if ((tif->tif_flags & 0x800) == 0) {
      uVar2 = TIFFGetStrileOffset(tif,strip);
      iVar1 = _TIFFSeekOK(tif,uVar2);
      if (iVar1 == 0) {
        TIFFErrorExtR(tif,module,"Seek error at scanline %u, strip %u",(ulong)tif->tif_row,
                      (ulong)strip);
        tif_local = (TIFF *)0xffffffffffffffff;
      }
      else {
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,buf,size);
        if (tVar3 != size) {
          TIFFErrorExtR(tif,module,"Read error at scanline %u; got %ld bytes, expected %ld",
                        (ulong)tif->tif_row,tVar3,size);
          tif_local = (TIFF *)0xffffffffffffffff;
        }
      }
    }
    else {
      n = 0;
      uVar2 = TIFFGetStrileOffset(tif,strip);
      if ((uVar2 < 0x8000000000000000) && (n = TIFFGetStrileOffset(tif,strip), n <= tif->tif_size))
      {
        if (0x7fffffffffffffff - size < n) {
          mb = 0;
        }
        else {
          mb = size;
          if (tif->tif_size < n + size) {
            mb = tif->tif_size - n;
          }
        }
      }
      else {
        mb = 0;
      }
      if (mb == size) {
        _TIFFmemcpy(buf,tif->tif_base + n,size);
      }
      else {
        TIFFErrorExtR(tif,module,"Read error at scanline %u, strip %u; got %ld bytes, expected %ld",
                      (ulong)tif->tif_row,(ulong)strip,mb,size);
        tif_local = (TIFF *)0xffffffffffffffff;
      }
    }
    return (tmsize_t)tif_local;
  }
  __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                ,599,"tmsize_t TIFFReadRawStrip1(TIFF *, uint32_t, void *, tmsize_t, const char *)")
  ;
}

Assistant:

static tmsize_t TIFFReadRawStrip1(TIFF *tif, uint32_t strip, void *buf,
                                  tmsize_t size, const char *module)
{
    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);
    if (!isMapped(tif))
    {
        tmsize_t cc;

        if (!SeekOK(tif, TIFFGetStrileOffset(tif, strip)))
        {
            TIFFErrorExtR(tif, module,
                          "Seek error at scanline %" PRIu32 ", strip %" PRIu32,
                          tif->tif_row, strip);
            return ((tmsize_t)(-1));
        }
        cc = TIFFReadFile(tif, buf, size);
        if (cc != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at scanline %" PRIu32
                          "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, cc, size);
            return ((tmsize_t)(-1));
        }
    }
    else
    {
        tmsize_t ma = 0;
        tmsize_t n;
        if ((TIFFGetStrileOffset(tif, strip) > (uint64_t)TIFF_TMSIZE_T_MAX) ||
            ((ma = (tmsize_t)TIFFGetStrileOffset(tif, strip)) > tif->tif_size))
        {
            n = 0;
        }
        else if (ma > TIFF_TMSIZE_T_MAX - size)
        {
            n = 0;
        }
        else
        {
            tmsize_t mb = ma + size;
            if (mb > tif->tif_size)
                n = tif->tif_size - ma;
            else
                n = size;
        }
        if (n != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at scanline %" PRIu32 ", strip %" PRIu32
                          "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, strip, n, size);
            return ((tmsize_t)(-1));
        }
        _TIFFmemcpy(buf, tif->tif_base + ma, size);
    }
    return (size);
}